

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O3

void vu_getrect(t_gobj *z,_glist *glist,int *xp1,int *yp1,int *xp2,int *yp2)

{
  int iVar1;
  int iVar2;
  
  iVar1 = *(int *)((long)&z[3].g_pd[1].c_floatmethod + 4);
  iVar2 = text_xpix((t_text *)z,glist);
  *xp1 = iVar2 - iVar1;
  iVar2 = text_ypix((t_text *)z,glist);
  *yp1 = iVar2 + iVar1 * -2;
  *xp2 = iVar1 * 2 + *xp1 + *(int *)((long)&z[4].g_pd + 4);
  *yp2 = iVar1 * 4 + *yp1 + *(int *)&z[4].g_pd;
  return;
}

Assistant:

static void vu_getrect(t_gobj *z, t_glist *glist,
                       int *xp1, int *yp1, int *xp2, int *yp2)
{
    t_vu* x = (t_vu*)z;
    int hmargin = HMARGIN * IEMGUI_ZOOM(x), vmargin = VMARGIN * IEMGUI_ZOOM(x);

    *xp1 = text_xpix(&x->x_gui.x_obj, glist) - hmargin;
    *yp1 = text_ypix(&x->x_gui.x_obj, glist) - vmargin;
    *xp2 = *xp1 + x->x_gui.x_w + hmargin*2;
    *yp2 = *yp1 + x->x_gui.x_h + vmargin*2;
}